

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

string * google::protobuf::compiler::ruby::RubifyConstant
                   (string *__return_storage_ptr__,string *name)

{
  byte bVar1;
  byte *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  if (__return_storage_ptr__->_M_string_length != 0) {
    pbVar2 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    bVar1 = *pbVar2;
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      *pbVar2 = bVar1 - 0x20;
    }
    else if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
      std::operator+(&local_30,"PB_",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RubifyConstant(const std::string& name) {
  std::string ret = name;
  if (!ret.empty()) {
    if (IsLower(ret[0])) {
      // If it starts with a lowercase letter, capitalize it.
      ret[0] = UpperChar(ret[0]);
    } else if (!IsAlpha(ret[0])) {
      // Otherwise (e.g. if it begins with an underscore), we need to come up
      // with some prefix that starts with a capital letter. We could be smarter
      // here, e.g. try to strip leading underscores, but this may cause other
      // problems if the user really intended the name. So let's just prepend a
      // well-known suffix.
      ret = "PB_" + ret;
    }
  }

  return ret;
}